

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.hpp
# Opt level: O0

void __thiscall Analyser::Static::ZX8081::Target::Target(Target *this)

{
  bool bVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  Target *local_10;
  Target *this_local;
  
  local_10 = this;
  Static::Target::Target(&this->super_Target,ZX8081);
  Reflection::StructImpl<Analyser::Static::ZX8081::Target>::StructImpl
            (&this->super_StructImpl<Analyser::Static::ZX8081::Target>);
  (this->super_Target)._vptr_Target = (_func_int **)&PTR__Target_00c96b28;
  (this->super_StructImpl<Analyser::Static::ZX8081::Target>).super_Struct._vptr_Struct =
       (_func_int **)&DAT_00c96b48;
  this->memory_model = Unexpanded;
  this->is_ZX81 = false;
  this->ZX80_uses_ZX81_ROM = false;
  std::__cxx11::string::string((string *)&this->loading_command);
  bVar1 = Reflection::StructImpl<Analyser::Static::ZX8081::Target>::needs_declare
                    (&this->super_StructImpl<Analyser::Static::ZX8081::Target>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"memory_model",&local_41)
    ;
    Reflection::StructImpl<Analyser::Static::ZX8081::Target>::
    declare<Analyser::Static::ZX8081::Target::MemoryModel>
              (&this->super_StructImpl<Analyser::Static::ZX8081::Target>,&this->memory_model,
               &local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"is_ZX81",&local_69);
    Reflection::StructImpl<Analyser::Static::ZX8081::Target>::declare<bool>
              (&this->super_StructImpl<Analyser::Static::ZX8081::Target>,&this->is_ZX81,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"ZX80_uses_ZX81_ROM",&local_91);
    Reflection::StructImpl<Analyser::Static::ZX8081::Target>::declare<bool>
              (&this->super_StructImpl<Analyser::Static::ZX8081::Target>,&this->ZX80_uses_ZX81_ROM,
               &local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    Reflection::Enum::declare<Analyser::Static::ZX8081::Target::MemoryModel>
              ("MemoryModel","Unexpanded, SixteenKB, SixtyFourKB");
  }
  return;
}

Assistant:

Target(): Analyser::Static::Target(Machine::ZX8081) {
		if(needs_declare()) {
			DeclareField(memory_model);
			DeclareField(is_ZX81);
			DeclareField(ZX80_uses_ZX81_ROM);
			AnnounceEnum(MemoryModel);
		}
	}